

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O0

void dequantize_row_q6_K(block_q6_K *x,float *y,int64_t k)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar8;
  int8_t q4;
  int8_t q3;
  int8_t q2;
  int8_t q1;
  int is;
  int l;
  int n;
  int8_t *sc;
  uint8_t *qh;
  uint8_t *ql;
  float d;
  int i;
  int64_t nb;
  undefined4 local_48;
  undefined4 local_44;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined4 local_24;
  undefined8 local_10;
  
  local_10 = in_RSI;
  for (local_24 = 0; (long)local_24 < in_RDX / 0x100; local_24 = local_24 + 1) {
    fVar8 = ggml_lookup_fp16_to_fp32(*(ggml_fp16_t *)(in_RDI + (long)local_24 * 0xd2 + 0xd0));
    local_30 = in_RDI + (long)local_24 * 0xd2;
    local_38 = in_RDI + (long)local_24 * 0xd2 + 0x80;
    local_40 = in_RDI + (long)local_24 * 0xd2 + 0xc0;
    for (local_44 = 0; local_44 < 0x100; local_44 = local_44 + 0x80) {
      for (local_48 = 0; local_48 < 0x20; local_48 = local_48 + 1) {
        iVar7 = local_48 / 0x10;
        bVar1 = *(byte *)(local_30 + (local_48 + 0x20));
        bVar2 = *(byte *)(local_38 + local_48);
        bVar3 = *(byte *)(local_30 + local_48);
        bVar4 = *(byte *)(local_38 + local_48);
        bVar5 = *(byte *)(local_30 + (local_48 + 0x20));
        bVar6 = *(byte *)(local_38 + local_48);
        *(float *)(local_10 + (long)local_48 * 4) =
             fVar8 * (float)(int)*(char *)(local_40 + iVar7) *
             (float)(int)(char)((*(byte *)(local_30 + local_48) & 0xf |
                                (*(byte *)(local_38 + local_48) & 3) << 4) - 0x20);
        *(float *)(local_10 + (long)(local_48 + 0x20) * 4) =
             fVar8 * (float)(int)*(char *)(local_40 + (iVar7 + 2)) *
             (float)(int)(char)((bVar1 & 0xf | (byte)(((int)(uint)bVar2 >> 2 & 3U) << 4)) - 0x20);
        *(float *)(local_10 + (long)(local_48 + 0x40) * 4) =
             fVar8 * (float)(int)*(char *)(local_40 + (iVar7 + 4)) *
             (float)(int)(char)(((byte)((int)(uint)bVar3 >> 4) |
                                (byte)(((int)(uint)bVar4 >> 4 & 3U) << 4)) - 0x20);
        *(float *)(local_10 + (long)(local_48 + 0x60) * 4) =
             fVar8 * (float)(int)*(char *)(local_40 + (iVar7 + 6)) *
             (float)(int)(char)(((byte)((int)(uint)bVar5 >> 4) |
                                (byte)(((int)(uint)bVar6 >> 6) << 4)) - 0x20);
      }
      local_10 = local_10 + 0x200;
      local_30 = local_30 + 0x40;
      local_38 = local_38 + 0x20;
      local_40 = local_40 + 8;
    }
  }
  return;
}

Assistant:

void dequantize_row_q6_K(const block_q6_K * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    for (int i = 0; i < nb; i++) {
        const float d = GGML_FP16_TO_FP32(x[i].d);

        const uint8_t * GGML_RESTRICT ql = x[i].ql;
        const uint8_t * GGML_RESTRICT qh = x[i].qh;
        const int8_t  * GGML_RESTRICT sc = x[i].scales;

        for (int n = 0; n < QK_K; n += 128) {
            for (int l = 0; l < 32; ++l) {
                int is = l/16;
                const int8_t q1 = (int8_t)((ql[l +  0] & 0xF) | (((qh[l] >> 0) & 3) << 4)) - 32;
                const int8_t q2 = (int8_t)((ql[l + 32] & 0xF) | (((qh[l] >> 2) & 3) << 4)) - 32;
                const int8_t q3 = (int8_t)((ql[l +  0]  >> 4) | (((qh[l] >> 4) & 3) << 4)) - 32;
                const int8_t q4 = (int8_t)((ql[l + 32]  >> 4) | (((qh[l] >> 6) & 3) << 4)) - 32;
                y[l +  0] = d * sc[is + 0] * q1;
                y[l + 32] = d * sc[is + 2] * q2;
                y[l + 64] = d * sc[is + 4] * q3;
                y[l + 96] = d * sc[is + 6] * q4;
            }
            y  += 128;
            ql += 64;
            qh += 32;
            sc += 8;
        }
    }
}